

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  uint *puVar9;
  byte *pbVar10;
  long lVar11;
  vec<3U,_float> *in_RDX;
  vec<3U,_float> *in_RSI;
  long *in_RDI;
  uint c_1;
  uint64 d [3];
  uint64 s_1;
  uint64 error;
  color_quad_u8 block_colors [4];
  uint16 H_1;
  uint16 L_1;
  uint i_1;
  uint16 H;
  uint16 r_1;
  uint16 g_1;
  uint16 b_1;
  uint16 r0_1;
  uint16 g0_1;
  uint16 b0_1;
  uint16 L;
  uint16 r;
  uint16 g;
  uint16 b;
  uint16 r0;
  uint16 g0;
  uint16 b0;
  uint solutions_count;
  uint iterations;
  bool improved;
  bool preserveL;
  vector<unsigned_int> solutions;
  uint c;
  uint8 s;
  color_quad_u8 *pixel;
  uint i;
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  uint64 hist [4];
  uint16 H0;
  uint16 L0;
  undefined8 in_stack_fffffffffffffd08;
  vector<unsigned_int> *in_stack_fffffffffffffd10;
  uint *in_stack_fffffffffffffd18;
  color_quad_u8 *in_stack_fffffffffffffd20;
  color_quad<unsigned_char,_int> *local_2a8;
  ushort local_2a0;
  ushort local_294;
  uint local_240;
  uint local_214;
  uint local_1bc;
  long local_1b8 [4];
  ulong local_198;
  ulong local_190;
  color_quad<unsigned_char,_int> local_188 [4];
  color_quad<unsigned_char,_int> cStack_178;
  ushort local_174;
  ushort local_172;
  uint local_170;
  ushort local_16a;
  ushort local_168;
  ushort local_166;
  ushort local_164;
  ushort local_162;
  ushort local_160;
  ushort local_15e;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  ushort local_140;
  ushort local_13e;
  uint local_13c;
  int local_138;
  byte local_132;
  byte local_131;
  vector<unsigned_int> local_130;
  uint local_120;
  byte local_119;
  color_quad<unsigned_char,_int> *local_118;
  uint local_10c;
  long local_108 [12];
  long local_a8 [12];
  long local_48 [5];
  ushort local_1c;
  ushort local_1a;
  
  pfVar8 = vec<3U,_float>::operator[](in_RSI,0);
  iVar5 = math::clamp<int>((int)(*pfVar8 * 32.0),0,0x1f);
  pfVar8 = vec<3U,_float>::operator[](in_RSI,1);
  iVar6 = math::clamp<int>((int)(*pfVar8 * 64.0),0,0x3f);
  pfVar8 = vec<3U,_float>::operator[](in_RSI,2);
  iVar7 = math::clamp<int>((int)(*pfVar8 * 32.0),0,0x1f);
  local_1a = (ushort)(iVar5 << 0xb) | (ushort)(iVar6 << 5) | (ushort)iVar7;
  pfVar8 = vec<3U,_float>::operator[](in_RDX,0);
  iVar5 = math::clamp<int>((int)(*pfVar8 * 32.0),0,0x1f);
  pfVar8 = vec<3U,_float>::operator[](in_RDX,1);
  iVar6 = math::clamp<int>((int)(*pfVar8 * 64.0),0,0x3f);
  pfVar8 = vec<3U,_float>::operator[](in_RDX,2);
  iVar7 = math::clamp<int>((int)(*pfVar8 * 32.0),0,0x1f);
  local_1c = (ushort)(iVar5 << 0xb) | (ushort)(iVar6 << 5) | (ushort)iVar7;
  memset(local_48,0,0x20);
  memset(local_a8,0,0x60);
  memset(local_108,0,0x60);
  for (local_10c = 0; local_10c < *(uint *)(*in_RDI + 0x10); local_10c = local_10c + 1) {
    local_118 = (color_quad<unsigned_char,_int> *)(*(long *)(*in_RDI + 8) + (ulong)local_10c * 4);
    local_119 = *(byte *)(*(long *)(*in_RDI + 0x18) + (ulong)local_10c);
    local_48[local_119] = local_48[local_119] + 1;
    for (local_120 = 0; local_120 < 3; local_120 = local_120 + 1) {
      bVar3 = color_quad<unsigned_char,_int>::operator[](local_118,local_120);
      local_a8[(ulong)local_119 * 3 + (ulong)local_120] =
           (long)(int)((uint)bVar3 << 1) + local_a8[(ulong)local_119 * 3 + (ulong)local_120];
      bVar3 = color_quad<unsigned_char,_int>::operator[](local_118,local_120);
      bVar4 = color_quad<unsigned_char,_int>::operator[](local_118,local_120);
      local_108[(ulong)local_119 * 3 + (ulong)local_120] =
           (long)(int)((uint)bVar3 * (uint)bVar4) +
           local_108[(ulong)local_119 * 3 + (ulong)local_120];
    }
  }
  vector<unsigned_int>::vector
            (in_stack_fffffffffffffd10,(uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  local_131 = (ulong)(local_48[1] + local_48[3]) < (ulong)(local_48[0] + local_48[2]);
  local_132 = 1;
  for (local_138 = 8; (local_132 & 1) != 0 && local_138 != 0; local_138 = local_138 + -1) {
    local_132 = 0;
    local_13c = 0;
    local_13e = local_1a & 0x1f;
    local_140 = (ushort)((int)(uint)local_1a >> 5) & 0x3f;
    local_142 = (ushort)((int)(uint)local_1a >> 0xb);
    if (local_13e == 0) {
      local_144 = 0;
    }
    else {
      local_144 = local_13e - 1;
    }
    for (; (uint)local_144 <= local_13e + 1 && local_144 < 0x20; local_144 = local_144 + 1) {
      if (local_140 == 0) {
        local_146 = 0;
      }
      else {
        local_146 = local_140 - 1;
      }
      for (; (uint)local_146 <= local_140 + 1 && local_146 < 0x40; local_146 = local_146 + 1) {
        if (local_142 == 0) {
          local_148 = 0;
        }
        else {
          local_148 = local_142 - 1;
        }
        for (; uVar2 = local_13c, (uint)local_148 <= local_142 + 1 && local_148 < 0x20;
            local_148 = local_148 + 1) {
          local_14a = local_148 << 0xb | local_146 << 5 | local_144;
          if (local_14a != local_1a) {
            if (local_1c < local_14a) {
              local_214 = CONCAT22(local_1c,local_14a);
            }
            else {
              local_214 = CONCAT22(local_14a,local_1c);
            }
            local_13c = local_13c + 1;
            puVar9 = vector<unsigned_int>::operator[](&local_130,uVar2);
            *puVar9 = local_214;
          }
        }
      }
    }
    local_15e = local_1c & 0x1f;
    local_160 = (ushort)((int)(uint)local_1c >> 5) & 0x3f;
    local_162 = (ushort)((int)(uint)local_1c >> 0xb);
    if (local_15e == 0) {
      local_164 = 0;
    }
    else {
      local_164 = local_15e - 1;
    }
    for (; (uint)local_164 <= local_15e + 1 && local_164 < 0x20; local_164 = local_164 + 1) {
      if (local_160 == 0) {
        local_166 = 0;
      }
      else {
        local_166 = local_160 - 1;
      }
      for (; (uint)local_166 <= local_160 + 1 && local_166 < 0x40; local_166 = local_166 + 1) {
        if (local_162 == 0) {
          local_168 = 0;
        }
        else {
          local_168 = local_162 - 1;
        }
        for (; uVar2 = local_13c, (uint)local_168 <= local_162 + 1 && local_168 < 0x20;
            local_168 = local_168 + 1) {
          local_16a = local_168 << 0xb | local_166 << 5 | local_164;
          if (local_16a != local_1c) {
            if (local_1a < local_16a) {
              local_240 = CONCAT22(local_1a,local_16a);
            }
            else {
              local_240 = CONCAT22(local_16a,local_1a);
            }
            local_13c = local_13c + 1;
            puVar9 = vector<unsigned_int>::operator[](&local_130,uVar2);
            *puVar9 = local_240;
          }
        }
      }
    }
    vector<unsigned_int>::begin(&local_130);
    vector<unsigned_int>::begin(&local_130);
    std::sort<unsigned_int*>((uint *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    for (local_170 = 0; local_170 < local_13c; local_170 = local_170 + 1) {
      if (local_170 == 0) {
LAB_0024228e:
        puVar9 = vector<unsigned_int>::operator[](&local_130,local_170);
        local_172 = (ushort)*puVar9;
        puVar9 = vector<unsigned_int>::operator[](&local_130,local_170);
        uVar1 = *puVar9;
        local_174 = (ushort)(uVar1 >> 0x10);
        if (local_172 == local_174) {
          if ((local_131 & 1) == 0) {
            if (((local_172 ^ 0xffff) & 0x1f) == 0) {
              if (((local_172 ^ 0xffff) & 0xf800) == 0) {
                local_294 = 0;
                if (((local_172 ^ 0xffff) & 0x7e0) != 0) {
                  local_294 = 0x20;
                }
              }
              else {
                local_294 = 0x800;
              }
            }
            else {
              local_294 = 1;
            }
          }
          else {
            local_294 = (ushort)(local_172 == 0);
          }
          local_172 = local_172 + local_294;
          if ((local_131 & 1) == 0) {
            local_2a0 = (ushort)(local_174 == 0xffff);
          }
          else if ((uVar1 & 0x1f0000) == 0) {
            if ((uVar1 & 0xf8000000) == 0) {
              local_2a0 = 0;
              if ((uVar1 & 0x7e00000) != 0) {
                local_2a0 = 0x20;
              }
            }
            else {
              local_2a0 = 0x800;
            }
          }
          else {
            local_2a0 = 1;
          }
          local_174 = local_174 - local_2a0;
        }
        local_2a8 = local_188;
        do {
          color_quad<unsigned_char,_int>::color_quad(local_2a8);
          local_2a8 = local_2a8 + 1;
        } while (local_2a8 != &cStack_178);
        dxt1_block::get_block_colors4
                  (in_stack_fffffffffffffd20,(uint16)((ulong)in_stack_fffffffffffffd18 >> 0x30),
                   (uint16)((ulong)in_stack_fffffffffffffd18 >> 0x20));
        local_190 = 0;
        for (local_198 = 0; local_198 < 4; local_198 = local_198 + 1) {
          for (local_1bc = 0; local_1bc < 3; local_1bc = local_1bc + 1) {
            lVar11 = local_48[local_198];
            pbVar10 = color_quad<unsigned_char,_int>::operator[](local_188 + local_198,local_1bc);
            bVar3 = *pbVar10;
            pbVar10 = color_quad<unsigned_char,_int>::operator[](local_188 + local_198,local_1bc);
            in_stack_fffffffffffffd10 =
                 (vector<unsigned_int> *)(lVar11 * (ulong)bVar3 * (ulong)*pbVar10);
            in_stack_fffffffffffffd18 = (uint *)local_a8[local_198 * 3 + (ulong)local_1bc];
            in_stack_fffffffffffffd20 =
                 (color_quad_u8 *)
                 color_quad<unsigned_char,_int>::operator[](local_188 + local_198,local_1bc);
            local_1b8[local_1bc] =
                 (long)in_stack_fffffffffffffd10 +
                 (local_108[local_198 * 3 + (ulong)local_1bc] -
                 (long)in_stack_fffffffffffffd18 *
                 (ulong)(in_stack_fffffffffffffd20->field_0).field_0.r);
          }
          if ((*(byte *)(*in_RDI + 0x31) & 1) == 0) {
            lVar11 = local_1b8[0] + local_1b8[1];
          }
          else {
            lVar11 = local_1b8[0] * 8 + local_1b8[1] * 0x19;
          }
          local_190 = lVar11 + local_1b8[2] + local_190;
        }
        if (local_190 < *(ulong *)(in_RDI[1] + 8)) {
          local_1a = local_172;
          *(ushort *)in_RDI[1] = local_172;
          local_1c = local_174;
          *(ushort *)(in_RDI[1] + 2) = local_174;
          *(ulong *)(in_RDI[1] + 8) = local_190;
          if (*(long *)(in_RDI[1] + 8) == 0) goto LAB_00242748;
          local_132 = 1;
        }
      }
      else {
        puVar9 = vector<unsigned_int>::operator[](&local_130,local_170);
        uVar1 = *puVar9;
        puVar9 = vector<unsigned_int>::operator[](&local_130,local_170 - 1);
        if (uVar1 != *puVar9) goto LAB_0024228e;
      }
    }
  }
LAB_00242748:
  vector<unsigned_int>::~vector(in_stack_fffffffffffffd10);
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color) {
  uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
  uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

  uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
  for (uint i = 0; i < m_pParams->m_num_pixels; i++) {
    const color_quad_u8& pixel = m_pParams->m_pPixels[i];
    uint8 s = m_pParams->m_pSelectors[i];
    hist[s]++;
    for (uint c = 0; c < 3; c++) {
      D2[s][c] += pixel[c] * 2;
      DD[s][c] += pixel[c] * pixel[c];
    }
  }
  crnlib::vector<uint> solutions(54);
  bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
  bool improved = true;

  for (uint iterations = 8; improved && iterations; iterations--) {
    improved = false;
    uint solutions_count = 0;
    for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 L = r << 11 | g << 5 | b;
          if (L != L0)
            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
        }
      }
    }
    for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 H = r << 11 | g << 5 | b;
          if (H != H0)
            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
        }
      }
    }
    std::sort(solutions.begin(), solutions.begin() + solutions_count);
    for (uint i = 0; i < solutions_count; i++) {
      if (i && solutions[i] == solutions[i - 1])
        continue;
      uint16 L = solutions[i] & 0xFFFF;
      uint16 H = solutions[i] >> 16;
      if (L == H) {
        L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800 : ~L & 0x7E0 ? 0x20 : 0 : !L ? 0x1 : 0;
        H -= preserveL ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800 : H & 0x7E0 ? 0x20 : 0 : H == 0xFFFF ? 0x1 : 0;
      }
      color_quad_u8 block_colors[4];
      dxt1_block::get_block_colors4(block_colors, L, H);
      uint64 error = 0;
      for (uint64 s = 0, d[3]; s < 4; s++) {
        for (uint c = 0; c < 3; c++)
          d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
        error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
      }
      if (error < m_pResults->m_error) {
        m_pResults->m_low_color = L0 = L;
        m_pResults->m_high_color = H0 = H;
        m_pResults->m_error = error;
        if (!m_pResults->m_error)
          return;
        improved = true;
      }
    }
  }
}